

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

uniformMatrixNdv
gl4cts::EnhancedLayouts::Utils::getUniformMatrixNdv(Functions *gl,GLuint n_columns,GLuint n_rows)

{
  TestError *pTVar1;
  uniformMatrixNdv local_20;
  uniformMatrixNdv result;
  GLuint n_rows_local;
  GLuint n_columns_local;
  Functions *gl_local;
  
  if (n_columns == 2) {
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix2dv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix2x3dv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x375);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix2x4dv;
    }
  }
  else if (n_columns == 3) {
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix3x2dv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix3dv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x385);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix3x4dv;
    }
  }
  else {
    if (n_columns != 4) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid number of columns",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x399);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix4x2dv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix4x3dv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x395);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix4dv;
    }
  }
  return local_20;
}

Assistant:

uniformMatrixNdv getUniformMatrixNdv(const glw::Functions& gl, glw::GLuint n_columns, glw::GLuint n_rows)
{
	uniformMatrixNdv result = 0;

	switch (n_columns)
	{
	case 2:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix2dv;
			break;
		case 3:
			result = gl.uniformMatrix2x3dv;
			break;
		case 4:
			result = gl.uniformMatrix2x4dv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 3:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix3x2dv;
			break;
		case 3:
			result = gl.uniformMatrix3dv;
			break;
		case 4:
			result = gl.uniformMatrix3x4dv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 4:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix4x2dv;
			break;
		case 3:
			result = gl.uniformMatrix4x3dv;
			break;
		case 4:
			result = gl.uniformMatrix4dv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	default:
		TCU_FAIL("Invalid number of columns");
	}

	return result;
}